

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSampleVerifierUtil.cpp
# Opt level: O3

void vkt::texture::util::calcTexelGridCoordRange
               (Vec3 *unnormalizedCoordMin,Vec3 *unnormalizedCoordMax,int coordBits,
               IVec3 *gridCoordMin,IVec3 *gridCoordMax)

{
  float fVar1;
  int iVar2;
  int iVar3;
  byte bVar4;
  bool bVar5;
  int iVar6;
  bool bVar7;
  long lVar8;
  double *__iptr;
  float *pfVar9;
  float fVar10;
  float fVar11;
  double dVar12;
  double dVar13;
  double intPart [2];
  float local_70;
  float local_6c;
  double local_68;
  double local_60 [2];
  Vec3 *local_50;
  Vec3 *local_48;
  IVec3 *local_40;
  IVec3 *local_38;
  
  bVar4 = (byte)coordBits;
  iVar6 = 1 << (bVar4 & 0x1f);
  fVar10 = (float)iVar6;
  iVar6 = iVar6 + -1;
  lVar8 = 0;
  local_50 = unnormalizedCoordMin;
  local_48 = unnormalizedCoordMax;
  local_40 = gridCoordMax;
  local_38 = gridCoordMin;
  do {
    fVar11 = local_48->m_data[lVar8];
    __iptr = &local_68;
    pfVar9 = &local_6c;
    bVar5 = true;
    fVar1 = local_50->m_data[lVar8];
    do {
      bVar7 = bVar5;
      dVar12 = modf((double)fVar1,__iptr);
      *pfVar9 = (float)dVar12;
      if (fVar1 < 0.0) {
        *__iptr = *__iptr + -1.0;
        *pfVar9 = (float)dVar12 + 1.0;
      }
      dVar12 = local_60[0];
      __iptr = local_60;
      pfVar9 = &local_70;
      bVar5 = false;
      fVar1 = fVar11;
    } while (bVar7);
    dVar13 = floor(local_68);
    dVar12 = floor(dVar12);
    fVar11 = floorf(local_6c * fVar10);
    iVar2 = (int)fVar11;
    if ((int)fVar11 < 1) {
      iVar2 = 0;
    }
    fVar11 = ceilf(local_70 * fVar10);
    iVar3 = (int)fVar11;
    if (iVar6 <= (int)fVar11) {
      iVar3 = iVar6;
    }
    local_38->m_data[lVar8] = ((int)dVar13 << (bVar4 & 0x1f)) + iVar2;
    local_40->m_data[lVar8] = ((int)dVar12 << (bVar4 & 0x1f)) + iVar3;
    lVar8 = lVar8 + 1;
  } while (lVar8 != 3);
  return;
}

Assistant:

void calcTexelGridCoordRange (const Vec3&	unnormalizedCoordMin,
							  const Vec3&	unnormalizedCoordMax,
							  const int		coordBits,
							  IVec3&		gridCoordMin,
							  IVec3&		gridCoordMax)
{
	const int subdivisions = 1 << coordBits;

	for (int compNdx = 0; compNdx < 3; ++compNdx)
	{
		const float comp[2] = {unnormalizedCoordMin[compNdx],
							   unnormalizedCoordMax[compNdx]};

		float	fracPart[2];
		double	intPart[2];

		for (int ndx = 0; ndx < 2; ++ndx)
		{
			fracPart[ndx] = (float) deModf(comp[ndx], &intPart[ndx]);

			if (comp[ndx] < 0.0f)
			{
				intPart [ndx] -= 1.0;
				fracPart[ndx] += 1.0f;
			}
		}

		const deInt32	nearestTexelGridOffsetMin = (deInt32) deFloor(intPart[0]);
		const deInt32	nearestTexelGridOffsetMax = (deInt32) deFloor(intPart[1]);

		const deInt32	subTexelGridCoordMin	  = de::max((deInt32) deFloor(fracPart[0] * (float) subdivisions), (deInt32) 0);
		const deInt32	subTexelGridCoordMax	  = de::min((deInt32) deCeil (fracPart[1] * (float) subdivisions), (deInt32) (subdivisions - 1));

	    gridCoordMin[compNdx] = nearestTexelGridOffsetMin * (deInt32) subdivisions + subTexelGridCoordMin;
	    gridCoordMax[compNdx] = nearestTexelGridOffsetMax * (deInt32) subdivisions + subTexelGridCoordMax;
	}
}